

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

Tool * __thiscall
anon_unknown.dwarf_146826::BuildFileImpl::getOrCreateTool
          (BuildFileImpl *this,StringRef name,Node *forNode)

{
  tool_set *this_00;
  StringRef message;
  Tool *pTVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  pointer *__ptr;
  char *pcVar5;
  Tool *pTVar6;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_bool>
  pVar7;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> tool;
  Tool *local_98;
  long *local_90;
  size_t local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar5 = name.Data;
  this_00 = &this->tools;
  iVar2 = llvm::StringMapImpl::FindKey(&this_00->super_StringMapImpl,name);
  if ((iVar2 == -1) || ((long)iVar2 == (ulong)(this->tools).super_StringMapImpl.NumBuckets)) {
    (*this->delegate->_vptr_BuildFileDelegate[8])(&local_98,this->delegate,pcVar5,name.Length);
    pTVar6 = local_98;
    if (local_98 == (Tool *)0x0) {
      local_70 = &local_60;
      if (pcVar5 == (char *)0x0) {
        local_68 = 0;
        local_60 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar5,pcVar5 + name.Length);
      }
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1a8a24);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_40 = *plVar4;
        lStack_38 = plVar3[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar4;
        local_50 = (long *)*plVar3;
      }
      local_48 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_80 = *plVar4;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      message.Length = local_88;
      message.Data = (char *)local_90;
      error(this,forNode,message);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      pTVar6 = (Tool *)0x0;
    }
    else {
      pVar7 = llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
              ::try_emplace<>(this_00,name);
      pTVar1 = local_98;
      local_98 = (Tool *)0x0;
      plVar3 = *(long **)(*(long *)pVar7.first.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                                   .Ptr.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                         + 8);
      *(Tool **)(*(long *)pVar7.first.
                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                          .Ptr.
                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                + 8) = pTVar1;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    if (local_98 != (Tool *)0x0) {
      (*local_98->_vptr_Tool[1])();
    }
  }
  else {
    pTVar6 = (Tool *)(this_00->super_StringMapImpl).TheTable[iVar2][1].StrLen;
  }
  return pTVar6;
}

Assistant:

Tool* getOrCreateTool(StringRef name, llvm::yaml::Node* forNode) {
    // First, check the map.
    auto it = tools.find(name);
    if (it != tools.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the tool.
    auto tool = delegate.lookupTool(name);
    if (!tool) {
      error(forNode, "invalid tool (" + name.str() +") type in 'tools' map");
      return nullptr;
    }
    auto result = tool.get();
    tools[name] = std::move(tool);

    return result;
  }